

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<char> local_29;
  undefined1 local_28 [8];
  string text;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_28,"hello\nworld!\r\nfoo\rbar\n",&local_29);
  std::allocator<char>::~allocator(&local_29);
  print_lines1((string *)local_28);
  print_lines2((string *)local_28);
  print_lines3((string *)local_28);
  print_lines4((string *)local_28);
  print_lines5((string *)local_28);
  std::__cxx11::string::~string((string *)local_28);
  return 0;
}

Assistant:

int main()
{
  const std::string text = "hello\nworld!\r\nfoo\rbar\n";

  print_lines1(text);
  print_lines2(text);
  print_lines3(text);
  print_lines4(text);
  print_lines5(text);
}